

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_benchmarker.hpp
# Opt level: O3

TestDescriptor *
hayai::Benchmarker::RegisterTest
          (char *fixtureName,char *testName,size_t runs,size_t iterations,TestFactory *testFactory,
          TestParametersDescriptor *parameters)

{
  pointer *pppTVar1;
  iterator __position;
  size_t sVar2;
  TestDescriptor *this;
  Benchmarker *pBVar3;
  bool isDisabled;
  TestDescriptor *descriptor;
  TestParametersDescriptor local_48;
  
  sVar2 = strlen(testName);
  if (sVar2 < 9) {
    isDisabled = false;
  }
  else {
    isDisabled = testName[8] == RegisterTest::disabledPrefix[8] &&
                 *(long *)testName == *(long *)RegisterTest::disabledPrefix;
    testName = testName + (ulong)isDisabled * 9;
  }
  this = (TestDescriptor *)operator_new(0x98);
  inja::std::vector<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
  ::vector(&local_48._parameters,&parameters->_parameters);
  TestDescriptor::TestDescriptor
            (this,fixtureName,testName,runs,iterations,testFactory,&local_48,isDisabled);
  inja::std::vector<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
  ::~vector(&local_48._parameters);
  descriptor = this;
  pBVar3 = Instance();
  __position._M_current =
       (pBVar3->_tests).
       super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pBVar3->_tests).
      super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<hayai::TestDescriptor*,std::allocator<hayai::TestDescriptor*>>::
    _M_realloc_insert<hayai::TestDescriptor*const&>
              ((vector<hayai::TestDescriptor*,std::allocator<hayai::TestDescriptor*>> *)
               &pBVar3->_tests,__position,&descriptor);
  }
  else {
    *__position._M_current = this;
    pppTVar1 = &(pBVar3->_tests).
                super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
    descriptor = this;
  }
  return descriptor;
}

Assistant:

static TestDescriptor* RegisterTest(
            const char* fixtureName,
            const char* testName,
            std::size_t runs,
            std::size_t iterations,
            TestFactory* testFactory,
            TestParametersDescriptor parameters
        )
        {
            // Determine if the test has been disabled.
            static const char* disabledPrefix = "DISABLED_";
            bool isDisabled = ((::strlen(testName) >= 9) &&
                               (!::memcmp(testName, disabledPrefix, 9)));

            if (isDisabled)
                testName += 9;

            // Add the descriptor.
            TestDescriptor* descriptor = new TestDescriptor(fixtureName,
                                                            testName,
                                                            runs,
                                                            iterations,
                                                            testFactory,
                                                            parameters,
                                                            isDisabled);

            Instance()._tests.push_back(descriptor);

            return descriptor;
        }